

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  char *pcVar8;
  cmCTestGenericHandler *pcVar9;
  cmake *this_00;
  size_t sVar10;
  cmGlobalGenerator *pcVar11;
  ostream *poVar12;
  string *psVar13;
  char *pcVar14;
  string *option;
  pointer pbVar15;
  _Alloc_hider _Var16;
  string cmakelists_file;
  string cmakeConfigureCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string local_238;
  string local_218;
  uint local_1f4;
  string local_1f0;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[7];
  if (pcVar8 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,pcVar8,(allocator<char> *)&local_218);
    cmSystemTools::ExpandListArgument((string *)local_1d0,&local_58,false);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)local_1d0,pcVar2,&local_218);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0._8_8_ == 0) {
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_1d0);
LAB_001d7373:
    _Var16._M_p = (pointer)local_1d0._0_8_;
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
LAB_001d738d:
      operator_delete(_Var16._M_p,local_1d0._16_8_ + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"CTEST_CONFIGURE_COMMAND","");
    pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 pcVar8,(this->super_cmCTestHandlerCommand).Quiet);
LAB_001d70d7:
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"CTEST_LABELS_FOR_SUBPROJECTS","");
      pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      if (pcVar8 != (char *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",pcVar8,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar9 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar9->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar9);
      pcVar9->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_001d7398;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"CTEST_CMAKE_GENERATOR","");
    pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1d0);
      goto LAB_001d7373;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"SourceDirectory","");
    cmCTest::GetCTestConfiguration(&local_218,pcVar2,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if (local_218._M_string_length == 0) {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      local_1d0._16_8_ = local_218.field_2._M_allocated_capacity;
      _Var16._M_p = local_218._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_001d738d;
    }
    else {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_218._M_dataplus._M_p,
                 local_218._M_dataplus._M_p + local_218._M_string_length);
      std::__cxx11::string::append((char *)&local_1f0);
      bVar5 = cmsys::SystemTools::FileExists(&local_1f0);
      if (bVar5) {
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        local_1d0._0_8_ = local_1d0 + 0x10;
        sVar10 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,pcVar8,pcVar8 + sVar10);
        pcVar11 = cmake::CreateGlobalGenerator(this_00,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        if (pcVar11 == (cmGlobalGenerator *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (*pcVar11->_vptr_cmGlobalGenerator[0x23])(pcVar11);
          (*pcVar11->_vptr_cmGlobalGenerator[1])(pcVar11);
        }
        local_1d0._0_8_ = local_1d0 + 0x10;
        local_38 = pcVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"\"","");
        psVar13 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::__cxx11::string::_M_append(local_1d0,(ulong)(psVar13->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_1d0);
        pbVar4 = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar6 = false;
        local_1f4 = uVar7;
        if (local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar15 = local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar6 = false;
          do {
            std::__cxx11::string::append(local_1d0);
            std::__cxx11::string::_M_append(local_1d0,(ulong)(pbVar15->_M_dataplus)._M_p);
            std::__cxx11::string::append(local_1d0);
            pcVar8 = (pbVar15->_M_dataplus)._M_p;
            pcVar14 = strstr(pcVar8,"CMAKE_BUILD_TYPE=");
            if ((pcVar14 != (char *)0x0) ||
               (pcVar8 = strstr(pcVar8,"CMAKE_BUILD_TYPE:STRING="), pcVar8 != (char *)0x0)) {
              bVar6 = true;
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar4);
        }
        if (((local_1f4 & 1) == 0 && !bVar6) &&
           (psVar13 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
           psVar13->_M_string_length != 0)) {
          std::__cxx11::string::append(local_1d0);
          psVar13 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          std::__cxx11::string::_M_append(local_1d0,(ulong)(psVar13->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_1d0);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        paVar1 = &local_238.field_2;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"CTEST_USE_LAUNCHERS","");
        bVar6 = cmMakefile::IsOn(pcVar3,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          std::__cxx11::string::append(local_1d0);
        }
        std::__cxx11::string::append(local_1d0);
        std::__cxx11::string::append(local_1d0);
        std::__cxx11::string::append(local_1d0);
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"CTEST_CMAKE_GENERATOR_PLATFORM","");
        pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
          std::__cxx11::string::append(local_1d0);
          std::__cxx11::string::append(local_1d0);
          std::__cxx11::string::append(local_1d0);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"CTEST_CMAKE_GENERATOR_TOOLSET","");
        pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
          std::__cxx11::string::append(local_1d0);
          std::__cxx11::string::append(local_1d0);
          std::__cxx11::string::append(local_1d0);
        }
        std::__cxx11::string::append(local_1d0);
        std::__cxx11::string::_M_append(local_1d0,(ulong)local_218._M_dataplus._M_p);
        std::__cxx11::string::append(local_1d0);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,(char *)local_1d0._0_8_,(this->super_cmCTestHandlerCommand).Quiet);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"CMakeLists.txt file does not exist [",0x24);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,local_1f0._M_dataplus._M_p,
                             local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) goto LAB_001d70d7;
    }
  }
  pcVar9 = (cmCTestGenericHandler *)0x0;
LAB_001d7398:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return pcVar9;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS]) {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  const char* ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (ctestConfigureCommand && *ctestConfigureCommand) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       ctestConfigureCommand, this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmakeGeneratorName && *cmakeGeneratorName) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator* gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        delete gg;
      }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmakeGeneratorPlatform && *cmakeGeneratorPlatform) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmakeGeneratorToolset && *cmakeGeneratorToolset) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration(
        "ConfigureCommand", cmakeConfigureCommand.c_str(), this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}